

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int select_smallest_max_connected_cell(saucy *s,int start,int end)

{
  int *__ptr;
  int local_38;
  int local_34;
  int connections;
  int i;
  int *connection_list;
  int max_connections;
  int smallest_cell_size;
  int cell;
  int smallest_cell;
  int end_local;
  int start_local;
  saucy *s_local;
  
  smallest_cell_size = -1;
  connection_list._4_4_ = s->n;
  connection_list._0_4_ = -1;
  __ptr = zeros(s->n);
  for (max_connections = start; (s->left).clen[max_connections] == 0;
      max_connections = max_connections + 1) {
  }
  for (; max_connections < end; max_connections = s->nextnon[max_connections]) {
    if ((s->left).clen[max_connections] <= connection_list._4_4_) {
      local_38 = 0;
      for (local_34 = s->depAdj[(s->left).lab[max_connections]];
          local_34 < s->depAdj[(s->left).lab[max_connections] + 1]; local_34 = local_34 + 1) {
        if (__ptr[s->depEdg[local_34]] == 0) {
          local_38 = local_38 + 1;
          __ptr[s->depEdg[local_34]] = 1;
        }
      }
      if (((s->left).clen[max_connections] < connection_list._4_4_) ||
         ((int)connection_list < local_38)) {
        connection_list._4_4_ = (s->left).clen[max_connections];
        connection_list._0_4_ = local_38;
        smallest_cell_size = max_connections;
      }
      for (local_34 = s->depAdj[(s->left).lab[max_connections]];
          local_34 < s->depAdj[(s->left).lab[max_connections] + 1]; local_34 = local_34 + 1) {
        __ptr[s->depEdg[local_34]] = 0;
      }
    }
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  return smallest_cell_size;
}

Assistant:

static int
select_smallest_max_connected_cell(struct saucy *s, int start, int end)
{
    int smallest_cell = -1, cell;
    int smallest_cell_size = s->n;
    int max_connections = -1;
    int * connection_list = zeros(s->n);
    
    cell = start;
    while( !s->left.clen[cell] ) cell++;
    while( cell < end ) {       
        if (s->left.clen[cell] <= smallest_cell_size) {
            int i, connections = 0;;
            for (i = s->depAdj[s->left.lab[cell]]; i < s->depAdj[s->left.lab[cell]+1]; i++) {
                if (!connection_list[s->depEdg[i]]) {
                    connections++;
                    connection_list[s->depEdg[i]] = 1;
                }
            }
            if ((s->left.clen[cell] < smallest_cell_size) || (connections > max_connections)) {
                smallest_cell_size = s->left.clen[cell];
                max_connections = connections;
                smallest_cell = cell;
            }
            for (i = s->depAdj[s->left.lab[cell]]; i < s->depAdj[s->left.lab[cell]+1]; i++)
                connection_list[s->depEdg[i]] = 0;
        }
        cell = s->nextnon[cell];
    }
    
    ABC_FREE( connection_list );
    return smallest_cell;
}